

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::GenerateSetBit_abi_cxx11_(int bitIndex)

{
  string *in_RDI;
  int in_stack_00000064;
  string *in_stack_00000068;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  anon_unknown_0::GenerateSetBitInternal(in_stack_00000068,in_stack_00000064);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

std::string GenerateSetBit(int bitIndex) {
  return GenerateSetBitInternal("", bitIndex);
}